

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> __thiscall
duckdb::CreateDecimalReader<long>(duckdb *this,ParquetReader *reader,ParquetColumnSchema *schema)

{
  PhysicalType PVar1;
  NotImplementedException *this_00;
  allocator local_39;
  string local_38;
  
  PVar1 = (schema->type).physical_type_;
  if (PVar1 == INT64) {
    make_uniq<duckdb::TemplatedColumnReader<long,duckdb::TemplatedParquetValueConversion<long>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_38,reader,schema);
  }
  else if (PVar1 == INT32) {
    make_uniq<duckdb::TemplatedColumnReader<int,duckdb::TemplatedParquetValueConversion<long>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_38,reader,schema);
  }
  else {
    if (PVar1 != INT16) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Unimplemented internal type for CreateDecimalReader",&local_39
                );
      NotImplementedException::NotImplementedException(this_00,&local_38);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    make_uniq<duckdb::TemplatedColumnReader<short,duckdb::TemplatedParquetValueConversion<long>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_38,reader,schema);
  }
  *(pointer *)this = local_38._M_dataplus._M_p;
  return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
         (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
}

Assistant:

unique_ptr<ColumnReader> CreateDecimalReader(ParquetReader &reader, const ParquetColumnSchema &schema) {
	switch (schema.type.InternalType()) {
	case PhysicalType::INT16:
		return make_uniq<TemplatedColumnReader<int16_t, TemplatedParquetValueConversion<T>>>(reader, schema);
	case PhysicalType::INT32:
		return make_uniq<TemplatedColumnReader<int32_t, TemplatedParquetValueConversion<T>>>(reader, schema);
	case PhysicalType::INT64:
		return make_uniq<TemplatedColumnReader<int64_t, TemplatedParquetValueConversion<T>>>(reader, schema);
	default:
		throw NotImplementedException("Unimplemented internal type for CreateDecimalReader");
	}
}